

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O2

void bitrv2(int n,int *ip,double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long local_c0;
  
  uVar19 = 1;
  for (uVar14 = n >> 2; 8 < (int)uVar14; uVar14 = uVar14 >> 2) {
    uVar19 = uVar19 * 2;
  }
  iVar17 = n >> 1;
  iVar21 = uVar19 * 4;
  if (uVar14 == 8) {
    iVar4 = uVar19 * 8;
    local_c0 = 0;
    uVar13 = 0;
    if (0 < (int)uVar19) {
      uVar13 = (ulong)uVar19;
    }
    for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
      iVar18 = (int)uVar16 * 4;
      iVar12 = ip[(long)(int)uVar19 + uVar16];
      iVar20 = iVar12 * 2;
      iVar5 = iVar21 + iVar12 * 2;
      iVar6 = iVar4 + iVar12 * 2;
      iVar7 = uVar19 * 0xc + iVar12 * 2;
      iVar8 = uVar19 * 0xc + iVar17 + iVar12 * 2;
      iVar9 = iVar17 + uVar19 * 8 + iVar12 * 2;
      iVar10 = iVar17 + iVar21 + iVar12 * 2;
      for (lVar15 = 0; local_c0 != lVar15; lVar15 = lVar15 + 4) {
        iVar11 = (int)lVar15;
        lVar25 = (long)iVar18 + (long)*(int *)((long)ip + lVar15 + (long)(int)uVar19 * 4) * 2;
        dVar1 = a[iVar11 + iVar20];
        iVar22 = iVar20 + 1 + iVar11;
        dVar2 = a[iVar22];
        uVar14 = (uint)lVar25;
        dVar3 = a[(int)(uVar14 | 1)];
        a[iVar11 + iVar20] = a[lVar25];
        a[iVar22] = dVar3;
        a[lVar25] = dVar1;
        a[(int)(uVar14 | 1)] = dVar2;
        iVar24 = uVar14 + iVar4;
        dVar1 = a[iVar5 + iVar11];
        iVar23 = iVar5 + 1 + iVar11;
        dVar2 = a[iVar23];
        iVar22 = uVar14 + 1 + iVar4;
        dVar3 = a[iVar22];
        a[iVar5 + iVar11] = a[iVar24];
        a[iVar23] = dVar3;
        a[iVar24] = dVar1;
        a[iVar22] = dVar2;
        uVar14 = iVar24 + uVar19 * -4;
        dVar1 = a[iVar6 + iVar11];
        iVar22 = iVar6 + iVar11 + 1;
        dVar2 = a[iVar22];
        dVar3 = a[(int)(uVar14 | 1)];
        a[iVar6 + iVar11] = a[(int)uVar14];
        a[iVar22] = dVar3;
        a[(int)uVar14] = dVar1;
        a[(int)(uVar14 | 1)] = dVar2;
        dVar1 = a[iVar7 + iVar11];
        iVar22 = iVar7 + 1 + iVar11;
        dVar2 = a[iVar22];
        lVar25 = (long)(int)(uVar14 + iVar4);
        iVar23 = uVar14 + 1 + iVar4;
        dVar3 = a[iVar23];
        a[iVar7 + iVar11] = a[lVar25];
        a[iVar22] = dVar3;
        a[lVar25] = dVar1;
        a[iVar23] = dVar2;
        dVar1 = a[iVar8 + iVar11];
        dVar2 = (a + (iVar8 + iVar11))[1];
        dVar3 = (a + lVar25 + 2)[1];
        a[iVar8 + iVar11] = a[lVar25 + 2];
        (a + (iVar8 + iVar11))[1] = dVar3;
        a[lVar25 + 2] = dVar1;
        (a + lVar25 + 2)[1] = dVar2;
        dVar1 = a[iVar9 + iVar11];
        dVar2 = (a + (iVar9 + iVar11))[1];
        dVar3 = (a + (int)(uVar14 + 2))[1];
        a[iVar9 + iVar11] = a[(int)(uVar14 + 2)];
        (a + (iVar9 + iVar11))[1] = dVar3;
        a[(int)(uVar14 + 2)] = dVar1;
        (a + (int)(uVar14 + 2))[1] = dVar2;
        iVar24 = uVar14 + 2 + iVar21;
        dVar1 = a[iVar10 + iVar11];
        dVar2 = (a + (iVar10 + iVar11))[1];
        dVar3 = (a + iVar24)[1];
        a[iVar10 + iVar11] = a[iVar24];
        (a + (iVar10 + iVar11))[1] = dVar3;
        a[iVar24] = dVar1;
        (a + iVar24)[1] = dVar2;
        iVar22 = iVar24 + uVar19 * -8;
        lVar25 = (long)(iVar17 + iVar12 * 2 + iVar11);
        dVar1 = (a + iVar22)[1];
        dVar2 = a[lVar25];
        dVar3 = (a + lVar25)[1];
        a[lVar25] = a[iVar22];
        (a + lVar25)[1] = dVar1;
        a[iVar22] = dVar2;
        (a + iVar22)[1] = dVar3;
        dVar1 = a[lVar25 + 2];
        dVar2 = (a + lVar25 + 2)[1];
        dVar3 = (a + (iVar22 + iVar17))[1];
        a[lVar25 + 2] = a[iVar22 + iVar17];
        (a + lVar25 + 2)[1] = dVar3;
        a[iVar22 + iVar17] = dVar1;
        (a + (iVar22 + iVar17))[1] = dVar2;
        iVar22 = iVar10 + iVar11 + 2;
        dVar1 = a[iVar22];
        iVar23 = iVar10 + iVar11 + 3;
        dVar2 = a[iVar23];
        lVar25 = (long)(iVar24 + iVar17);
        dVar3 = a[lVar25 + 1];
        a[iVar22] = a[lVar25];
        a[iVar23] = dVar3;
        a[lVar25] = dVar1;
        a[lVar25 + 1] = dVar2;
        iVar22 = iVar9 + 2 + iVar11;
        iVar23 = iVar17 + 2 + uVar14;
        dVar1 = a[iVar22];
        iVar24 = iVar9 + 3 + iVar11;
        dVar2 = a[iVar24];
        dVar3 = a[(long)iVar23 + 1];
        a[iVar22] = a[iVar23];
        a[iVar24] = dVar3;
        a[iVar23] = dVar1;
        a[(long)iVar23 + 1] = dVar2;
        iVar22 = iVar8 + 2 + iVar11;
        dVar1 = a[iVar22];
        iVar24 = iVar8 + 3 + iVar11;
        dVar2 = a[iVar24];
        lVar26 = (long)(iVar23 + iVar4);
        dVar3 = a[lVar26 + 1];
        a[iVar22] = a[lVar26];
        a[iVar24] = dVar3;
        a[lVar26] = dVar1;
        a[lVar26 + 1] = dVar2;
        lVar25 = (long)(iVar7 + 2 + iVar11);
        dVar2 = a[lVar25];
        dVar3 = (a + lVar25)[1];
        dVar1 = a[lVar26 + -1];
        a[lVar25] = a[lVar26 + -2];
        a[lVar25 + 1] = dVar1;
        a[lVar26 + -2] = dVar2;
        (a + lVar26 + -2)[1] = dVar3;
        iVar22 = iVar6 + 2 + iVar11;
        dVar1 = a[iVar22];
        dVar2 = (a + iVar22)[1];
        dVar3 = (a + (iVar23 + -2))[1];
        a[iVar22] = a[iVar23 + -2];
        (a + iVar22)[1] = dVar3;
        a[iVar23 + -2] = dVar1;
        (a + (iVar23 + -2))[1] = dVar2;
        iVar22 = iVar5 + 2 + iVar11;
        iVar23 = iVar21 + -2 + iVar23;
        dVar1 = a[iVar22];
        dVar2 = (a + iVar22)[1];
        dVar3 = (a + iVar23)[1];
        a[iVar22] = a[iVar23];
        (a + iVar22)[1] = dVar3;
        a[iVar23] = dVar1;
        (a + iVar23)[1] = dVar2;
        iVar11 = iVar20 + iVar11 + 2;
        iVar23 = iVar23 + uVar19 * -8;
        dVar1 = a[iVar11];
        dVar2 = (a + iVar11)[1];
        dVar3 = (a + iVar23)[1];
        a[iVar11] = a[iVar23];
        (a + iVar11)[1] = dVar3;
        a[iVar23] = dVar1;
        (a + iVar23)[1] = dVar2;
      }
      iVar18 = iVar18 + iVar20;
      iVar5 = iVar18 + iVar17;
      dVar1 = a[(long)iVar18 + 2];
      dVar2 = a[(long)iVar18 + 3];
      dVar3 = a[(long)iVar5 + 1];
      a[(long)iVar18 + 2] = a[iVar5];
      a[(long)iVar18 + 3] = dVar3;
      a[iVar5] = dVar1;
      a[(long)iVar5 + 1] = dVar2;
      iVar20 = iVar21 + iVar18 + 2;
      iVar5 = iVar5 + iVar4;
      dVar1 = a[iVar20];
      iVar12 = iVar18 + iVar21 + 3;
      dVar2 = a[iVar12];
      dVar3 = a[(long)iVar5 + 1];
      a[iVar20] = a[iVar5];
      a[iVar12] = dVar3;
      a[iVar5] = dVar1;
      a[(long)iVar5 + 1] = dVar2;
      iVar12 = iVar21 + iVar18 + iVar21 + 2;
      iVar5 = iVar5 + uVar19 * -4;
      dVar1 = a[iVar12];
      iVar20 = iVar21 + iVar18 + iVar21 + 3;
      dVar2 = a[iVar20];
      dVar3 = a[(long)iVar5 + 1];
      a[iVar12] = a[iVar5];
      a[iVar20] = dVar3;
      a[iVar5] = dVar1;
      a[(long)iVar5 + 1] = dVar2;
      dVar1 = a[(long)iVar12 + -2];
      dVar2 = (a + (long)iVar12 + -2)[1];
      dVar3 = (a + (iVar5 - iVar17))[1];
      a[(long)iVar12 + -2] = a[iVar5 - iVar17];
      (a + (long)iVar12 + -2)[1] = dVar3;
      a[iVar5 - iVar17] = dVar1;
      (a + (iVar5 - iVar17))[1] = dVar2;
      lVar15 = (long)(iVar12 + iVar17);
      dVar1 = a[lVar15];
      dVar2 = a[lVar15 + 1];
      dVar3 = a[iVar5 + 3];
      a[lVar15] = a[iVar5 + 2];
      a[lVar15 + 1] = dVar3;
      a[iVar5 + 2] = dVar1;
      a[iVar5 + 3] = dVar2;
      dVar1 = a[iVar12 + iVar21];
      iVar20 = iVar12 + iVar21 + 1;
      dVar2 = a[iVar20];
      lVar15 = (long)(iVar5 + iVar4);
      dVar3 = a[lVar15 + 1];
      a[iVar12 + iVar21] = a[lVar15];
      a[iVar20] = dVar3;
      a[lVar15] = dVar1;
      a[lVar15 + 1] = dVar2;
      local_c0 = local_c0 + 4;
    }
  }
  else {
    lVar15 = 0;
    uVar14 = uVar19;
    if ((int)uVar19 < 1) {
      uVar14 = 0;
    }
    for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
      iVar12 = (int)uVar13 * 4;
      iVar4 = ip[(long)(int)uVar19 + uVar13];
      iVar20 = iVar17 + iVar21 + iVar4;
      for (lVar25 = 0; lVar15 != lVar25; lVar25 = lVar25 + 4) {
        iVar5 = (int)lVar25;
        lVar26 = (long)*(int *)((long)ip + lVar25 + (long)(int)uVar19 * 4) + (long)iVar12;
        dVar1 = a[iVar4 + iVar5];
        dVar2 = (a + (iVar4 + iVar5))[1];
        dVar3 = (a + lVar26)[1];
        a[iVar4 + iVar5] = a[lVar26];
        (a + (iVar4 + iVar5))[1] = dVar3;
        a[lVar26] = dVar1;
        (a + lVar26)[1] = dVar2;
        iVar6 = iVar21 + iVar4 + iVar5;
        iVar7 = (int)lVar26;
        iVar8 = iVar21 + iVar7;
        dVar1 = a[iVar6];
        dVar2 = (a + iVar6)[1];
        dVar3 = (a + iVar8)[1];
        a[iVar6] = a[iVar8];
        (a + iVar6)[1] = dVar3;
        a[iVar8] = dVar1;
        (a + iVar8)[1] = dVar2;
        lVar26 = (long)(iVar20 + iVar5);
        dVar2 = a[lVar26];
        dVar3 = (a + lVar26)[1];
        dVar1 = a[(long)iVar8 + 3];
        a[lVar26] = a[(long)iVar8 + 2];
        a[lVar26 + 1] = dVar1;
        a[(long)iVar8 + 2] = dVar2;
        (a + (long)iVar8 + 2)[1] = dVar3;
        lVar26 = (long)(iVar17 + iVar4 + iVar5);
        dVar1 = (a + (iVar7 + 2))[1];
        dVar2 = a[lVar26];
        dVar3 = (a + lVar26)[1];
        a[lVar26] = a[iVar7 + 2];
        (a + lVar26)[1] = dVar1;
        a[iVar7 + 2] = dVar2;
        (a + (iVar7 + 2))[1] = dVar3;
        iVar6 = iVar7 + 2 + iVar17;
        dVar1 = a[lVar26 + 2];
        dVar2 = (a + lVar26 + 2)[1];
        dVar3 = (a + iVar6)[1];
        a[lVar26 + 2] = a[iVar6];
        (a + lVar26 + 2)[1] = dVar3;
        a[iVar6] = dVar1;
        (a + iVar6)[1] = dVar2;
        iVar6 = iVar20 + 2 + iVar5;
        dVar1 = a[iVar6];
        iVar9 = iVar20 + 3 + iVar5;
        dVar2 = a[iVar9];
        lVar26 = (long)(iVar17 + 2 + iVar8);
        dVar3 = a[lVar26 + 1];
        a[iVar6] = a[lVar26];
        a[iVar9] = dVar3;
        a[lVar26] = dVar1;
        a[lVar26 + 1] = dVar2;
        iVar6 = iVar21 + iVar4 + iVar5 + 2;
        dVar1 = a[iVar6];
        dVar2 = (a + iVar6)[1];
        dVar3 = (a + (iVar8 + iVar17))[1];
        a[iVar6] = a[iVar8 + iVar17];
        (a + iVar6)[1] = dVar3;
        a[iVar8 + iVar17] = dVar1;
        (a + (iVar8 + iVar17))[1] = dVar2;
        iVar5 = iVar4 + 2 + iVar5;
        dVar1 = a[iVar5];
        dVar2 = (a + iVar5)[1];
        dVar3 = (a + (iVar7 + iVar17))[1];
        a[iVar5] = a[iVar7 + iVar17];
        (a + iVar5)[1] = dVar3;
        a[iVar7 + iVar17] = dVar1;
        (a + (iVar7 + iVar17))[1] = dVar2;
      }
      iVar12 = iVar12 + iVar4;
      iVar20 = iVar12 + iVar17;
      dVar1 = a[(long)iVar12 + 2];
      dVar2 = a[(long)iVar12 + 3];
      dVar3 = a[(long)iVar20 + 1];
      a[(long)iVar12 + 2] = a[iVar20];
      a[(long)iVar12 + 3] = dVar3;
      a[iVar20] = dVar1;
      a[(long)iVar20 + 1] = dVar2;
      iVar4 = iVar12 + iVar21 + 2;
      dVar1 = a[iVar4];
      dVar2 = (a + iVar4)[1];
      dVar3 = (a + (iVar20 + iVar21))[1];
      a[iVar4] = a[iVar20 + iVar21];
      (a + iVar4)[1] = dVar3;
      a[iVar20 + iVar21] = dVar1;
      (a + (iVar20 + iVar21))[1] = dVar2;
      lVar15 = lVar15 + 4;
    }
  }
  return;
}

Assistant:

void bitrv2(int n, int *ip, double *a) {
  int j, j1, k, k1, l, m, nh, nm;
  double xr, xi, yr, yi;

  m = 1;
  for (l = n >> 2; l > 8; l >>= 2) {
    m <<= 1;
  }
  nh = n >> 1;
  nm = 4 * m;
  if (l == 8) {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + 2 * ip[m + k];
        k1 = 4 * k + 2 * ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= 2 * nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + 2 * ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += 2 * nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 -= nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= 2;
      k1 -= nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nh + 2;
      k1 += nh + 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 -= nh - nm;
      k1 += 2 * nm - 2;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  } else {
    for (k = 0; k < m; k++) {
      for (j = 0; j < k; j++) {
        j1 = 4 * j + ip[m + k];
        k1 = 4 * k + ip[m + j];
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nh;
        k1 += 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += 2;
        k1 += nh;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 += nm;
        k1 += nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nh;
        k1 -= 2;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
        j1 -= nm;
        k1 -= nm;
        xr = a[j1];
        xi = a[j1 + 1];
        yr = a[k1];
        yi = a[k1 + 1];
        a[j1] = yr;
        a[j1 + 1] = yi;
        a[k1] = xr;
        a[k1 + 1] = xi;
      }
      k1 = 4 * k + ip[m + k];
      j1 = k1 + 2;
      k1 += nh;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
      j1 += nm;
      k1 += nm;
      xr = a[j1];
      xi = a[j1 + 1];
      yr = a[k1];
      yi = a[k1 + 1];
      a[j1] = yr;
      a[j1 + 1] = yi;
      a[k1] = xr;
      a[k1 + 1] = xi;
    }
  }
}